

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemClearAndResize(Mem *pMem,int szNew)

{
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x20) < in_ESI) {
    local_4 = sqlite3VdbeMemGrow((Mem *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),0,0x13ddbb);
  }
  else {
    *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 0x18);
    *(ushort *)(in_RDI + 8) = *(ushort *)(in_RDI + 8) & 0xd;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemClearAndResize(Mem *pMem, int szNew){
  assert( szNew>0 );
  assert( (pMem->flags & MEM_Dyn)==0 || pMem->szMalloc==0 );
  if( pMem->szMalloc<szNew ){
    return sqlite3VdbeMemGrow(pMem, szNew, 0);
  }
  assert( (pMem->flags & MEM_Dyn)==0 );
  pMem->z = pMem->zMalloc;
  pMem->flags &= (MEM_Null|MEM_Int|MEM_Real);
  return SQLITE_OK;
}